

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O3

void SDL_WM_SetCaption(char *title,char *icon)

{
  if (WindowTitle != (char *)0x0) {
    (*SDL20_free)(WindowTitle);
  }
  if (WindowIconTitle != (char *)0x0) {
    (*SDL20_free)(WindowIconTitle);
  }
  if (title == (char *)0x0) {
    WindowTitle = (char *)0x0;
  }
  else {
    WindowTitle = (*SDL20_strdup)(title);
  }
  if (icon == (char *)0x0) {
    WindowIconTitle = (char *)0x0;
  }
  else {
    WindowIconTitle = (*SDL20_strdup)(icon);
  }
  if (VideoWindow20 != (SDL_Window *)0x0) {
    (*SDL20_SetWindowTitle)(VideoWindow20,WindowTitle);
    return;
  }
  return;
}

Assistant:

SDLCALL
SDL_WM_SetCaption(const char *title, const char *icon)
{
    if (WindowTitle) {
        SDL20_free(WindowTitle);
    }
    if (WindowIconTitle) {
        SDL20_free(WindowIconTitle);
    }
    WindowTitle = title ? SDL20_strdup(title) : NULL;
    WindowIconTitle = icon ? SDL20_strdup(icon) : NULL;
    if (VideoWindow20) {
        SDL20_SetWindowTitle(VideoWindow20, WindowTitle);
    }
}